

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader15.cpp
# Opt level: O0

void __thiscall COLLADASaxFWL::NodeLoader15::begin__instance_light(NodeLoader15 *this)

{
  instance_light__AttributeData *in_stack_00000128;
  NodeLoader15 *in_stack_00000130;
  
  begin__instance_light(in_stack_00000130,in_stack_00000128);
  return;
}

Assistant:

bool NodeLoader15::begin__instance_light( const COLLADASaxFWL15::instance_light__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__instance_light(attributeData));
COLLADASaxFWL::instance_light__AttributeData attrData;
attrData.present_attributes = 0;
attrData.sid = attributeData.sid;
attrData.name = attributeData.name;
if ( (attributeData.present_attributes & COLLADASaxFWL15::instance_light__AttributeData::ATTRIBUTE_URL_PRESENT) == COLLADASaxFWL15::instance_light__AttributeData::ATTRIBUTE_URL_PRESENT ) {
    attrData.url = attributeData.url;
    attrData.present_attributes |= COLLADASaxFWL::instance_light__AttributeData::ATTRIBUTE_URL_PRESENT;
}
return mLoader->begin__instance_light(attrData);
}